

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::PositionalList<int,_args::detail::vector,_args::ValueReader>::ParseValue
          (PositionalList<int,_args::detail::vector,_args::ValueReader> *this,string *value_)

{
  int v;
  int local_14;
  
  ValueReader::operator()
            ((ValueReader *)&this->field_0xd0,&(this->super_PositionalBase).super_NamedBase.name,
             value_,&local_14);
  std::vector<int,_std::allocator<int>_>::insert
            (&this->values,
             (const_iterator)
             (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_14);
  (this->super_PositionalBase).super_NamedBase.super_Base.matched = true;
  return;
}

Assistant:

virtual void ParseValue(const std::string &value_) override
            {
                T v;
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, v))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, v);
#endif
                values.insert(std::end(values), v);
                matched = true;
            }